

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

void Abc_FrameMiniAigSetCoRequireds(Abc_Frame_t *pAbc,int *pRequireds)

{
  Gia_Man_t *pGVar1;
  Vec_Int_t *pVVar2;
  char *__s;
  
  if (pRequireds == (int *)0x0) {
    __s = "Required times are not given.";
  }
  else if (pAbc == (Abc_Frame_t *)0x0) {
    __s = "ABC framework is not initialized by calling Abc_Start().";
  }
  else {
    pGVar1 = Abc_FrameReadGia(pAbc);
    if (pGVar1 != (Gia_Man_t *)0x0) {
      Vec_IntFreeP(&pGVar1->vCoReqs);
      pVVar2 = Vec_IntAllocArrayCopy(pRequireds,pGVar1->vCos->nSize);
      pGVar1->vCoReqs = pVVar2;
      return;
    }
    __s = "Current network in ABC framework is not defined.";
  }
  puts(__s);
  return;
}

Assistant:

void Abc_FrameMiniAigSetCoRequireds( Abc_Frame_t * pAbc, int * pRequireds )
{
    Gia_Man_t * pGia;
    if ( pRequireds == NULL )
        { printf( "Required times are not given.\n" ); return; }
    if ( pAbc == NULL )
        { printf( "ABC framework is not initialized by calling Abc_Start().\n" ); return; }
    pGia = Abc_FrameReadGia( pAbc );
    if ( pGia == NULL )
        { printf( "Current network in ABC framework is not defined.\n" ); return; }
    Vec_IntFreeP( &pGia->vCoReqs );
    pGia->vCoReqs = Vec_IntAllocArrayCopy( pRequireds, Gia_ManCoNum(pGia) );
}